

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

linked_ptr<const_testing::CardinalityInterface> * __thiscall
testing::internal::linked_ptr<const_testing::CardinalityInterface>::operator=
          (linked_ptr<const_testing::CardinalityInterface> *this,
          linked_ptr<const_testing::CardinalityInterface> *ptr)

{
  linked_ptr<const_testing::CardinalityInterface> *in_RSI;
  linked_ptr<const_testing::CardinalityInterface> *in_RDI;
  
  if (in_RSI != in_RDI) {
    depart(in_RSI);
    linked_ptr<testing::CardinalityInterface_const>::copy<testing::CardinalityInterface_const>
              (in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }